

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  ImU32 IVar5;
  GetterYs<float> *pGVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pGVar6 = this->Getter;
  iVar3 = pGVar6->Count;
  iVar4 = this->Transformer->YAxis;
  fVar13 = (float)((((double)(prim + 1) * pGVar6->XScale + pGVar6->X0) -
                   (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[iVar4].Min.x);
  fVar14 = (float)(((double)*(float *)((long)pGVar6->Ys +
                                      (long)(((prim + 1 + pGVar6->Offset) % iVar3 + iVar3) % iVar3)
                                      * (long)pGVar6->Stride) -
                   GImPlot->CurrentPlot->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                  (double)GImPlot->PixelRange[iVar4].Min.y);
  fVar12 = (this->P1).x;
  fVar15 = (this->P1).y;
  fVar11 = fVar15;
  if (fVar14 <= fVar15) {
    fVar11 = fVar14;
  }
  bVar9 = false;
  if ((fVar11 < (cull_rect->Max).y) &&
     (fVar11 = (float)(-(uint)(fVar14 <= fVar15) & (uint)fVar15 |
                      ~-(uint)(fVar14 <= fVar15) & (uint)fVar14), pfVar1 = &(cull_rect->Min).y,
     bVar9 = false, *pfVar1 <= fVar11 && fVar11 != *pfVar1)) {
    fVar11 = fVar12;
    if (fVar13 <= fVar12) {
      fVar11 = fVar13;
    }
    if (fVar11 < (cull_rect->Max).x) {
      fVar11 = (float)(~-(uint)(fVar13 <= fVar12) & (uint)fVar13 |
                      -(uint)(fVar13 <= fVar12) & (uint)fVar12);
      bVar9 = (cull_rect->Min).x <= fVar11 && fVar11 != (cull_rect->Min).x;
    }
  }
  if (bVar9 != false) {
    fVar11 = this->Weight;
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar12 = fVar13 - fVar12;
    fVar15 = fVar14 - fVar15;
    fVar10 = fVar12 * fVar12 + fVar15 * fVar15;
    if (0.0 < fVar10) {
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      fVar12 = fVar12 * (1.0 / fVar10);
      fVar15 = fVar15 * (1.0 / fVar10);
    }
    fVar11 = fVar11 * 0.5;
    fVar12 = fVar12 * fVar11;
    fVar11 = fVar11 * fVar15;
    pIVar7 = DrawList->_VtxWritePtr;
    (pIVar7->pos).x = (this->P1).x + fVar11;
    (pIVar7->pos).y = (this->P1).y - fVar12;
    pIVar7->uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar5;
    pIVar7[1].pos.x = fVar11 + fVar13;
    pIVar7[1].pos.y = fVar14 - fVar12;
    pIVar7[1].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar5;
    pIVar7[2].pos.x = fVar13 - fVar11;
    pIVar7[2].pos.y = fVar12 + fVar14;
    pIVar7[2].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar5;
    pIVar7[3].pos.x = (this->P1).x - fVar11;
    pIVar7[3].pos.y = fVar12 + (this->P1).y;
    pIVar7[3].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = DrawList->_VtxCurrentIdx;
    puVar8[1] = DrawList->_VtxCurrentIdx + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    puVar8[3] = DrawList->_VtxCurrentIdx;
    puVar8[4] = DrawList->_VtxCurrentIdx + 2;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar2.y = fVar14;
  IVar2.x = fVar13;
  this->P1 = IVar2;
  return bVar9;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }